

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World_3df.cpp
# Opt level: O0

void __thiscall
World_3df::save_elite(World_3df *this,shared_ptr<Population> *src,shared_ptr<Population> *dst)

{
  pointer *ppsVar1;
  iterator iVar2;
  type pPVar3;
  creatfitdict_t *__x;
  creat_t *__x_00;
  type pFVar4;
  reference pvVar5;
  type pCVar6;
  type this_00;
  chroms_t *this_01;
  const_reference this_02;
  type pCVar7;
  type pCVar8;
  double dVar9;
  Msg local_360;
  undefined1 local_330 [40];
  const_iterator local_308;
  shared_ptr<Creature> *local_300;
  __normal_iterator<boost::shared_ptr<Creature>_*,_std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>_>
  local_2f8;
  __normal_iterator<boost::shared_ptr<Creature>_*,_std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>_>
  local_2f0;
  const_iterator local_2e8;
  allocator local_2d9;
  string local_2d8 [39];
  allocator local_2b1;
  string local_2b0 [39];
  allocator local_289;
  string local_288 [32];
  Msg local_268;
  Msg local_238;
  Msg local_208;
  Msg local_1d8;
  Msg local_1a8;
  Msg local_178;
  Msg local_148;
  Msg local_118;
  undefined1 local_e8 [40];
  size_t dist;
  iterator local_b8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_b0;
  iterator mxit;
  size_t i;
  undefined1 local_70 [40];
  creat_t tmps;
  creatfitdict_t tmp;
  shared_ptr<Population> *dst_local;
  shared_ptr<Population> *src_local;
  World_3df *this_local;
  
  pPVar3 = boost::shared_ptr<Population>::operator->(src);
  __x = Population::get_creatures_fdict(pPVar3);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &tmps.
              super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,__x);
  pPVar3 = boost::shared_ptr<Population>::operator->(src);
  __x_00 = Population::get_creatures(pPVar3);
  std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>::vector
            ((vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_> *)
             (local_70 + 0x20),__x_00);
  World::get_log((World *)local_70);
  pFVar4 = boost::shared_ptr<util::logging::File_logger>::operator*
                     ((shared_ptr<util::logging::File_logger> *)local_70);
  util::logging::Msg::Msg((Msg *)&i,anon_var_dwarf_2ac22,L_NORM);
  (*(pFVar4->super_Ostream_logger).super_Logger._vptr_Logger[3])(pFVar4,&i);
  util::logging::Msg::~Msg((Msg *)&i);
  boost::shared_ptr<util::logging::File_logger>::~shared_ptr
            ((shared_ptr<util::logging::File_logger> *)local_70);
  mxit._M_current = (double *)0x0;
  while( true ) {
    iVar2._M_current = mxit._M_current;
    pPVar3 = boost::shared_ptr<Population>::operator->(src);
    if ((double *)pPVar3->ELITE_SIZE <= iVar2._M_current) break;
    ppsVar1 = &tmps.
               super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_b8 = std::vector<double,_std::allocator<double>_>::begin
                         ((vector<double,_std::allocator<double>_> *)ppsVar1);
    dist = (size_t)std::vector<double,_std::allocator<double>_>::end
                             ((vector<double,_std::allocator<double>_> *)ppsVar1);
    local_b0 = std::
               max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                         (local_b8._M_current,
                          (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                           )dist);
    local_e8._24_8_ =
         std::vector<double,_std::allocator<double>_>::begin
                   ((vector<double,_std::allocator<double>_> *)
                    &tmps.
                     super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_e8._16_8_ = local_b0._M_current;
    local_e8._32_8_ =
         std::
         distance<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                   ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                    local_e8._24_8_,local_b0);
    World::get_log((World *)local_e8);
    pFVar4 = boost::shared_ptr<util::logging::File_logger>::operator*
                       ((shared_ptr<util::logging::File_logger> *)local_e8);
    util::logging::Msg::Msg(&local_268,"...Zachowano stwora z pozycji [",L_NORM);
    util::logging::Msg::operator+(&local_238,&local_268,local_e8._32_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_288,"]: x1 = ",&local_289);
    util::logging::Msg::operator+(&local_208,&local_238,(string *)local_288);
    pvVar5 = std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
             ::operator[]((vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                           *)(local_70 + 0x20),local_e8._32_8_);
    pCVar6 = boost::shared_ptr<Creature>::operator->(pvVar5);
    dVar9 = Creature::get_phenotype(pCVar6,0,0,0);
    util::logging::Msg::operator+(&local_1d8,&local_208,dVar9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2b0,"; x2 = ",&local_2b1);
    util::logging::Msg::operator+(&local_1a8,&local_1d8,(string *)local_2b0);
    pvVar5 = std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
             ::operator[]((vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                           *)(local_70 + 0x20),local_e8._32_8_);
    pCVar6 = boost::shared_ptr<Creature>::operator->(pvVar5);
    pvVar5 = std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
             ::operator[]((vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                           *)(local_70 + 0x20),local_e8._32_8_);
    this_00 = boost::shared_ptr<Creature>::operator->(pvVar5);
    this_01 = Creature::get_chroms(this_00);
    this_02 = std::
              vector<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
              ::operator[](this_01,0);
    pCVar7 = boost::shared_ptr<Chromosome>::operator->(this_02);
    dVar9 = Creature::get_phenotype(pCVar6,0,0,pCVar7->ALLELE_SIZE);
    util::logging::Msg::operator+(&local_178,&local_1a8,dVar9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2d8,"; fitness: ",&local_2d9);
    util::logging::Msg::operator+(&local_148,&local_178,(string *)local_2d8);
    pvVar5 = std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
             ::operator[]((vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                           *)(local_70 + 0x20),local_e8._32_8_);
    pCVar6 = boost::shared_ptr<Creature>::operator->(pvVar5);
    dVar9 = Creature::get_fitness(pCVar6);
    util::logging::Msg::operator+(&local_118,&local_148,dVar9);
    (*(pFVar4->super_Ostream_logger).super_Logger._vptr_Logger[3])(pFVar4,&local_118);
    util::logging::Msg::~Msg(&local_118);
    util::logging::Msg::~Msg(&local_148);
    std::__cxx11::string::~string(local_2d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
    util::logging::Msg::~Msg(&local_178);
    util::logging::Msg::~Msg(&local_1a8);
    std::__cxx11::string::~string(local_2b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
    util::logging::Msg::~Msg(&local_1d8);
    util::logging::Msg::~Msg(&local_208);
    std::__cxx11::string::~string(local_288);
    std::allocator<char>::~allocator((allocator<char> *)&local_289);
    util::logging::Msg::~Msg(&local_238);
    util::logging::Msg::~Msg(&local_268);
    boost::shared_ptr<util::logging::File_logger>::~shared_ptr
              ((shared_ptr<util::logging::File_logger> *)local_e8);
    pvVar5 = std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
             ::operator[]((vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                           *)(local_70 + 0x20),local_e8._32_8_);
    pCVar6 = boost::shared_ptr<Creature>::operator->(pvVar5);
    Creature::set_elite(pCVar6,true);
    pPVar3 = boost::shared_ptr<Population>::operator->(dst);
    pvVar5 = std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
             ::operator[]((vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                           *)(local_70 + 0x20),local_e8._32_8_);
    pCVar8 = boost::shared_ptr<Creature>::operator*(pvVar5);
    (*pPVar3->_vptr_Population[2])(pPVar3,pCVar8);
    local_2f8._M_current =
         (shared_ptr<Creature> *)
         std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>::
         begin((vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_> *
               )(local_70 + 0x20));
    local_2f0 = __gnu_cxx::
                __normal_iterator<boost::shared_ptr<Creature>_*,_std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>_>
                ::operator+(&local_2f8,local_e8._32_8_);
    __gnu_cxx::
    __normal_iterator<boost::shared_ptr<Creature>const*,std::vector<boost::shared_ptr<Creature>,std::allocator<boost::shared_ptr<Creature>>>>
    ::__normal_iterator<boost::shared_ptr<Creature>*>
              ((__normal_iterator<boost::shared_ptr<Creature>const*,std::vector<boost::shared_ptr<Creature>,std::allocator<boost::shared_ptr<Creature>>>>
                *)&local_2e8,&local_2f0);
    local_300 = (shared_ptr<Creature> *)
                std::
                vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>::
                erase((vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                       *)(local_70 + 0x20),local_2e8);
    ppsVar1 = &tmps.
               super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_330._24_8_ =
         std::vector<double,_std::allocator<double>_>::begin
                   ((vector<double,_std::allocator<double>_> *)ppsVar1);
    local_330._32_8_ =
         __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
         operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                   (local_330 + 0x18),local_e8._32_8_);
    __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
    __normal_iterator<double*>
              ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
               &local_308,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               (local_330 + 0x20));
    local_330._16_8_ =
         std::vector<double,_std::allocator<double>_>::erase
                   ((vector<double,_std::allocator<double>_> *)ppsVar1,local_308);
    mxit._M_current = mxit._M_current + 1;
  }
  World::get_log((World *)local_330);
  pFVar4 = boost::shared_ptr<util::logging::File_logger>::operator*
                     ((shared_ptr<util::logging::File_logger> *)local_330);
  util::logging::Msg::Msg(&local_360,anon_var_dwarf_2ac38,L_NORM);
  (*(pFVar4->super_Ostream_logger).super_Logger._vptr_Logger[3])(pFVar4,&local_360);
  util::logging::Msg::~Msg(&local_360);
  boost::shared_ptr<util::logging::File_logger>::~shared_ptr
            ((shared_ptr<util::logging::File_logger> *)local_330);
  std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>::~vector
            ((vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_> *)
             (local_70 + 0x20));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &tmps.
              super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void World_3df::save_elite( shared_ptr<Population>& src, boost::shared_ptr<Population>& dst )
{
	Population::creatfitdict_t tmp(src->get_creatures_fdict());
	Population::creat_t tmps(src->get_creatures());

	(*get_log()) << "Zachowuję elity...";

	for(size_t i = 0; i < src->ELITE_SIZE; ++i)
	{
		Population::creatfitdict_t::iterator mxit = max_element(tmp.begin(), tmp.end());
		size_t dist = std::distance(tmp.begin(), mxit);

		(*get_log()) << util::logging::Msg("...Zachowano stwora z pozycji [") + static_cast<long long> (dist)
				+ "]: x1 = " + tmps[dist]->get_phenotype(0, 0, 0) + "; x2 = " + tmps[dist]->get_phenotype(0, 0,
				tmps[dist]->get_chroms()[0]->ALLELE_SIZE) + "; fitness: " + tmps[dist]-> get_fitness();

		tmps[dist]->set_elite(true);
		dst->add_creature(*tmps[dist]);

		tmps.erase(tmps.begin() + dist);
		tmp.erase(tmp.begin() + dist);
	}

	(*get_log()) << "Już";
}